

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

uint64_t __thiscall
fmp4_stream::ingest_stream::get_media_segment_data
          (ingest_stream *this,size_t index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *media_seg_dat)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  uint64_t __new_size;
  long lVar6;
  long lVar7;
  int k;
  ulong uVar8;
  
  lVar5 = *(long *)&this->media_fragment_;
  if (index < (ulong)((*(long *)&this->field_0xd8 - lVar5) / 1000)) {
    lVar6 = index * 1000;
    __new_size = *(long *)(lVar5 + 0x168 + lVar6) + *(long *)(lVar5 + 0x100 + lVar6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(media_seg_dat,__new_size);
    lVar5 = 0;
    uVar8 = 0;
    lVar7 = 0;
    while( true ) {
      lVar3 = *(long *)&this->media_fragment_;
      lVar1 = *(long *)(lVar3 + 0xd0 + lVar6);
      if ((ulong)((*(long *)(lVar3 + 0xd8 + lVar6) - lVar1) / 0xe0) <= uVar8) break;
      pvVar2 = *(void **)(lVar1 + 0x48 + lVar5);
      sVar4 = *(long *)(lVar1 + 0x50 + lVar5) - (long)pvVar2;
      if (sVar4 != 0) {
        memmove((media_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start,pvVar2,sVar4);
        lVar3 = *(long *)&this->media_fragment_;
      }
      lVar3 = *(long *)(lVar3 + 0xd0 + lVar6);
      lVar3 = (*(code *)**(undefined8 **)(lVar3 + lVar5))(lVar3 + lVar5);
      lVar7 = lVar7 + lVar3;
      uVar8 = uVar8 + 1;
      lVar5 = lVar5 + 0xe0;
    }
    pvVar2 = *(void **)(lVar3 + lVar6 + 0x138);
    sVar4 = *(long *)(lVar3 + lVar6 + 0x140) - (long)pvVar2;
    if (sVar4 != 0) {
      memmove((media_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_start + lVar7,pvVar2,sVar4);
      lVar3 = *(long *)&this->media_fragment_;
    }
    pvVar2 = *(void **)(lVar3 + 0x1a0 + lVar6);
    sVar4 = *(long *)(lVar3 + 0x1a8 + lVar6) - (long)pvVar2;
    if (sVar4 != 0) {
      memmove((media_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_start + lVar7 + *(long *)(lVar3 + lVar6 + 0x100),
              pvVar2,sVar4);
    }
  }
  else {
    __new_size = 0;
  }
  return __new_size;
}

Assistant:

uint64_t ingest_stream::get_media_segment_data(
		std::size_t index, std::vector<uint8_t> &media_seg_dat)
	{
		if (!(media_fragment_.size() > index))
			return 0;

		uint64_t ssize = media_fragment_[index].moof_box_.large_size_ + media_fragment_[index].mdat_box_.large_size_;
		media_seg_dat.resize(ssize);

		// copy emsgs
		size_t ptr_of = 0;
		for (int k = 0; k < media_fragment_[index].emsg_.size(); k++)
		{
			std::copy(media_fragment_[index].emsg_[k].box_data_.begin(),
				media_fragment_[index].emsg_[k].box_data_.end(),
				media_seg_dat.begin());
			ptr_of += media_fragment_[index].emsg_[k].size();
		}

		// copy moviefragmentbox
		std::copy(media_fragment_[index].moof_box_.box_data_.begin(), 
			      media_fragment_[index].moof_box_.box_data_.end(), 
			      media_seg_dat.begin() + ptr_of
	    );
		// copy mdat
		std::copy(media_fragment_[index].mdat_box_.box_data_.begin(), 
			      media_fragment_[index].mdat_box_.box_data_.end(), 
			      media_seg_dat.begin() + media_fragment_[index].moof_box_.large_size_ + ptr_of
	    );

		return ssize;
	}